

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsFrameworkOnApple(cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
    this_00 = this->Makefile;
    std::__cxx11::string::string((string *)&local_38,"APPLE",&local_59);
    bVar1 = cmMakefile::IsOn(this_00,&local_38);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_58,"FRAMEWORK",&local_5a);
      bVar1 = GetPropertyAsBool(this,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

cmState::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}